

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinSerializer<std::deque<int,_std::allocator<int>_>,_void>::
     serialize<OutputStream>(deque<int,_std::allocator<int>_> *s,OutputStream *ostream)

{
  _Map_pointer ppiVar1;
  int iVar2;
  int local_1c;
  
  ppiVar1 = (s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  iVar2 = (int)((ulong)((long)(s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 2) +
          (int)((ulong)((long)(s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 2) +
          ((((uint)((int)ppiVar1 -
                   *(int *)&(s->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                            super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(ppiVar1 == (_Map_pointer)0x0)) * 0x80;
  local_1c = iVar2;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  serialize_elems<OutputStream>(s,iVar2,ostream);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }